

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_bytes
          (TensorValue *this,TensorValue_RepeatedBytes *bytes)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TensorValue_RepeatedBytes *bytes_local;
  TensorValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (bytes != (TensorValue_RepeatedBytes *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>::GetOwningArena
                   (bytes);
    message_arena = (Arena *)bytes;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                              (message_arena_00,bytes,submessage_arena_00);
    }
    set_has_bytes(this);
    (this->value_).floats_ = (TensorValue_RepeatedFloats *)message_arena;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_bytes(::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes* bytes) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (bytes) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>::GetOwningArena(bytes);
    if (message_arena != submessage_arena) {
      bytes = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, bytes, submessage_arena);
    }
    set_has_bytes();
    value_.bytes_ = bytes;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.bytes)
}